

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatrixUtils.cpp
# Opt level: O2

set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
* getEigenSpaceBasis(set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
                     *__return_storage_ptr__,RationalNum **matrix,uint size,RationalNum eigenValue)

{
  bool bVar1;
  RationalNum *pRVar2;
  iterator iVar3;
  int i_1;
  ulong uVar4;
  long lVar5;
  int i;
  RationalNum **ppRVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  int j;
  ulong uVar10;
  uint local_dc;
  ulong local_d8;
  uint local_cc;
  RationalNum **local_c8;
  _Rb_tree<std::vector<RationalNum,std::allocator<RationalNum>>,std::vector<RationalNum,std::allocator<RationalNum>>,std::_Identity<std::vector<RationalNum,std::allocator<RationalNum>>>,std::less<std::vector<RationalNum,std::allocator<RationalNum>>>,std::allocator<std::vector<RationalNum,std::allocator<RationalNum>>>>
  *local_c0;
  RationalNum **local_b8;
  vector<RationalNum,_std::allocator<RationalNum>_> basisVector;
  RationalNum local_98;
  ulong local_88;
  RationalNum local_80;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> basisFields;
  RationalNum eigenValue_local;
  
  eigenValue_local.denominator = eigenValue.denominator;
  eigenValue_local.numerator = eigenValue.numerator;
  uVar10 = (ulong)size;
  local_cc = size;
  local_c0 = (_Rb_tree<std::vector<RationalNum,std::allocator<RationalNum>>,std::vector<RationalNum,std::allocator<RationalNum>>,std::_Identity<std::vector<RationalNum,std::allocator<RationalNum>>>,std::less<std::vector<RationalNum,std::allocator<RationalNum>>>,std::allocator<std::vector<RationalNum,std::allocator<RationalNum>>>>
              *)__return_storage_ptr__;
  local_c8 = (RationalNum **)operator_new__(uVar10 * 8);
  uVar4 = uVar10 << 4;
  local_d8 = uVar10;
  for (uVar8 = 0; uVar8 != local_d8; uVar8 = uVar8 + 1) {
    pRVar2 = (RationalNum *)operator_new__(uVar4);
    uVar10 = 0;
    do {
      RationalNum::RationalNum((RationalNum *)((long)&pRVar2->numerator + uVar10));
      uVar10 = uVar10 + 0x10;
    } while (uVar4 != uVar10);
    local_c8[uVar8] = pRVar2;
    for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 0x10) {
      RationalNum::operator=
                ((RationalNum *)((long)&pRVar2->numerator + uVar10),
                 (RationalNum *)((long)&matrix[uVar8]->numerator + uVar10));
    }
  }
  ppRVar6 = local_c8;
  for (uVar10 = 0; uVar4 != uVar10; uVar10 = uVar10 + 0x10) {
    RationalNum::operator-=
              ((RationalNum *)((long)&(*ppRVar6)->numerator + uVar10),&eigenValue_local);
    ppRVar6 = ppRVar6 + 1;
  }
  local_b8 = getGaussForm(local_c8,local_cc);
  *(_Rb_tree_color *)(local_c0 + 8) = _S_red;
  *(_Base_ptr *)(local_c0 + 0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)(local_c0 + 0x18) = (_Base_ptr)(local_c0 + 8);
  *(_Base_ptr *)(local_c0 + 0x20) = (_Base_ptr)(local_c0 + 8);
  *(size_t *)(local_c0 + 0x28) = 0;
  basisFields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &basisFields._M_t._M_impl.super__Rb_tree_header._M_header;
  basisFields._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  basisFields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  basisFields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar10 = 0;
  basisFields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       basisFields._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (uVar10 == local_d8) {
      local_dc = 0;
      do {
        if (local_cc <= local_dc) {
          for (uVar10 = 0; local_d8 != uVar10; uVar10 = uVar10 + 1) {
            if (local_b8[uVar10] != (RationalNum *)0x0) {
              operator_delete__(local_b8[uVar10]);
            }
            if (local_c8[uVar10] != (RationalNum *)0x0) {
              operator_delete__(local_c8[uVar10]);
            }
          }
          operator_delete__(local_b8);
          operator_delete__(local_c8);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree(&basisFields._M_t);
          return (set<std::vector<RationalNum,_std::allocator<RationalNum>_>,_std::less<std::vector<RationalNum,_std::allocator<RationalNum>_>_>,_std::allocator<std::vector<RationalNum,_std::allocator<RationalNum>_>_>_>
                  *)local_c0;
        }
        iVar3 = std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::find(&basisFields._M_t,&local_dc);
        if ((_Rb_tree_header *)iVar3._M_node == &basisFields._M_t._M_impl.super__Rb_tree_header) {
          std::vector<RationalNum,_std::allocator<RationalNum>_>::vector
                    (&basisVector,local_d8,(allocator_type *)&local_98);
          RationalNum::RationalNum(&local_98,1,1);
          RationalNum::operator=
                    ((RationalNum *)
                     ((ulong)local_dc * 0x10 +
                     CONCAT44(basisVector.
                              super__Vector_base<RationalNum,_std::allocator<RationalNum>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              basisVector.
                              super__Vector_base<RationalNum,_std::allocator<RationalNum>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_)),&local_98);
          uVar10 = 0;
          while (uVar10 != local_d8) {
            uVar7 = ~(uint)uVar10 + local_cc;
            uVar4 = 1;
            lVar5 = 0x10;
            uVar8 = 0;
            local_88 = uVar10;
            while( true ) {
              if (uVar8 == local_d8) goto LAB_00112f35;
              pRVar2 = local_b8[uVar7];
              RationalNum::RationalNum(&local_98,0,1);
              bVar1 = operator!=(pRVar2 + uVar8,&local_98);
              if (bVar1) break;
              uVar8 = uVar8 + 1;
              lVar5 = lVar5 + 0x10;
              uVar4 = uVar4 + 1;
            }
            lVar9 = (uVar8 & 0xffffffff) * 0x10;
            for (; uVar4 < local_d8; uVar4 = uVar4 + 1) {
              local_98.numerator._0_4_ = (int)uVar4;
              iVar3 = std::
                      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::find(&basisFields._M_t,(key_type_conflict *)&local_98);
              if (((_Rb_tree_header *)iVar3._M_node !=
                   &basisFields._M_t._M_impl.super__Rb_tree_header) || (uVar4 == local_dc)) {
                local_98 = operator*((RationalNum *)
                                     (CONCAT44(basisVector.
                                               super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                               basisVector.
                                               super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                                               ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                     lVar5),(RationalNum *)((long)&pRVar2->numerator + lVar5));
                RationalNum::operator+=
                          ((RationalNum *)
                           (CONCAT44(basisVector.
                                     super__Vector_base<RationalNum,_std::allocator<RationalNum>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     basisVector.
                                     super__Vector_base<RationalNum,_std::allocator<RationalNum>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_4_) + lVar9),
                           &local_98);
              }
              lVar5 = lVar5 + 0x10;
            }
            local_80 = RationalNum::operator-
                                 ((RationalNum *)
                                  (CONCAT44(basisVector.
                                            super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                            basisVector.
                                            super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                                            ._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar9
                                  ));
            local_98 = operator/(&local_80,pRVar2 + (uVar8 & 0xffffffff));
            RationalNum::operator=
                      ((RationalNum *)
                       (lVar9 + CONCAT44(basisVector.
                                         super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         basisVector.
                                         super__Vector_base<RationalNum,_std::allocator<RationalNum>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_4_)),&local_98
                      );
LAB_00112f35:
            uVar10 = local_88 + 1;
          }
          std::
          _Rb_tree<std::vector<RationalNum,std::allocator<RationalNum>>,std::vector<RationalNum,std::allocator<RationalNum>>,std::_Identity<std::vector<RationalNum,std::allocator<RationalNum>>>,std::less<std::vector<RationalNum,std::allocator<RationalNum>>>,std::allocator<std::vector<RationalNum,std::allocator<RationalNum>>>>
          ::_M_insert_unique<std::vector<RationalNum,std::allocator<RationalNum>>const&>
                    (local_c0,(vector<RationalNum,_std::allocator<RationalNum>_> *)
                              &basisVector.
                               super__Vector_base<RationalNum,_std::allocator<RationalNum>_>);
          std::_Vector_base<RationalNum,_std::allocator<RationalNum>_>::~_Vector_base
                    (&basisVector.super__Vector_base<RationalNum,_std::allocator<RationalNum>_>);
        }
        local_dc = local_dc + 1;
      } while( true );
    }
    lVar5 = 0;
    for (uVar4 = 0; local_d8 != uVar4; uVar4 = uVar4 + 1) {
      pRVar2 = local_b8[uVar10];
      RationalNum::RationalNum((RationalNum *)&basisVector,0,1);
      bVar1 = operator!=((RationalNum *)((long)&pRVar2->numerator + lVar5),
                         (RationalNum *)&basisVector);
      if (bVar1) {
        basisVector.super__Vector_base<RationalNum,_std::allocator<RationalNum>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = (undefined4)uVar4;
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::_M_insert_unique<unsigned_int>(&basisFields._M_t,(uint *)&basisVector);
        break;
      }
      lVar5 = lVar5 + 0x10;
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

set<vector<RationalNum>> getEigenSpaceBasis(RationalNum** matrix, unsigned int size, RationalNum eigenValue) {
    RationalNum** editedMatrix = new RationalNum* [size];
    for(int i = 0; i < size; i++) {
        editedMatrix[i] = new RationalNum [size];
        for(int j = 0; j < size; j++) editedMatrix[i][j] = matrix[i][j];
    }
    for(int i = 0; i < size; i++) editedMatrix[i][i] -= eigenValue;

    RationalNum** gaussForm = getGaussForm(editedMatrix, size);
    set<vector<RationalNum>> basis;

    set<unsigned int> basisFields;
    for(int i = 0; i < size; i++) {
        for(int j = 0; j < size; j++) {
            if(gaussForm[i][j] != 0ll) {
                basisFields.insert(j);
                break;
            }
        }
    }
    for(unsigned int k = 0; k < size; k++) {
        if(basisFields.find(k) != basisFields.end()) continue;
        vector<RationalNum> basisVector(size);
        basisVector[k] = 1ll;
        for(int i = 0; i < size; i++) {
            int cur = size;
            for(int j = 0; j < size; j++) {
                if(gaussForm[size - i - 1][j] != 0ll) {
                    cur = j;
                    break;
                }
            }
            if(cur == size) continue;
            for(int j = cur + 1; j < size; j++) {
                if(basisFields.find(j) != basisFields.end() || j == k) basisVector[cur] += basisVector[j] * gaussForm[size - i - 1][j];
            }
            basisVector[cur] = -basisVector[cur] / gaussForm[size - i - 1][cur];
        }
        basis.insert(basisVector);
    }

    for(int i = 0; i < size; i++) {
        delete[] gaussForm[i];
        delete[] editedMatrix[i];
    }
    delete[] gaussForm;
    delete[] editedMatrix;

    return basis;
}